

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_bnd.c
# Opt level: O0

void PrintFinalStats(void *cvode_mem)

{
  undefined8 in_RDI;
  long nfeLS;
  long nje;
  long ncfn;
  long nni;
  long netf;
  long nsetups;
  long nfe;
  long nst;
  int retval;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_c = CVodeGetNumSteps(in_RDI,&local_18);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_c = CVodeGetNumRhsEvals(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_c = CVodeGetNumLinSolvSetups(local_8,&local_28);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_c = CVodeGetNumErrTestFails(local_8,&local_30);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_c = CVodeGetNumNonlinSolvIters(local_8,&local_38);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_c = CVodeGetNumNonlinSolvConvFails(local_8,&local_40);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_c = CVodeGetNumJacEvals(local_8,&stack0xffffffffffffffb8);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_c = CVodeGetNumLinRhsEvals(local_8,&stack0xffffffffffffffb0);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe  = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",local_18,local_20,
         local_28,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  printf("nni = %-6ld ncfn = %-6ld netf = %ld\n \n",local_38,local_40,local_30);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem)
{
  int retval;
  long int nst, nfe, nsetups, netf, nni, ncfn, nje, nfeLS;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe  = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",
         nst, nfe, nsetups, nfeLS, nje);
  printf("nni = %-6ld ncfn = %-6ld netf = %ld\n \n", nni, ncfn, netf);

  return;
}